

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall QTextCursor::insertHtml(QTextCursor *this,QString *html)

{
  QTextCursorPrivate *pQVar1;
  QTextDocumentPrivate *pQVar2;
  long in_FS_OFFSET;
  QTextDocumentFragment fragment;
  QTextDocumentFragment local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar1 = (this->d).d.ptr;
    }
    pQVar2 = pQVar1->priv;
    if (pQVar2 != (QTextDocumentPrivate *)0x0) {
      local_28.d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      if ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar2 = ((this->d).d.ptr)->priv;
      }
      QTextDocumentFragment::fromHtml(&local_28,html,*(QTextDocument **)&pQVar2->field_0x8);
      insertFragment(this,&local_28);
      QTextDocumentFragment::~QTextDocumentFragment(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertHtml(const QString &html)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromHtml(html, d->priv->document());
    insertFragment(fragment);
}